

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_bio.cc
# Opt level: O3

int __thiscall
anon_unknown.dwarf_2f::AsyncBioMethodType::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this)

{
  uint uVar1;
  
  uVar1 = BIO_get_new_index();
  if (0 < (int)uVar1) {
    return uVar1 | 0x200;
  }
  abort();
}

Assistant:

static int AsyncBioMethodType() {
  static int type = [] {
    int idx = BIO_get_new_index();
    BSSL_CHECK(idx > 0);
    return idx | BIO_TYPE_FILTER;
  }();
  return type;
}